

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resource.cpp
# Opt level: O0

void __thiscall CampResource_Wait_Test::CampResource_Wait_Test(CampResource_Wait_Test *this)

{
  CampResource_Wait_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__CampResource_Wait_Test_00196578;
  return;
}

Assistant:

TEST(CampResource, Wait) {
  auto h = camp::resources::Host();
  h.wait();
  Event he = h.get_event_erased();
  h.wait_for(&he);
  Resource r(h);
  r.wait();
}